

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void vector_push_back(vector_t *vec,size_t value)

{
  size_t sVar1;
  size_t *psVar2;
  
  sVar1 = vec->capacity;
  if (vec->size == sVar1) {
    vec->capacity = sVar1 * 2;
    psVar2 = (size_t *)realloc(vec->values,sVar1 << 4);
    vec->values = psVar2;
    if (psVar2 == (size_t *)0x0) {
      vector_push_back_cold_1();
      return;
    }
  }
  vec->values[vec->size] = value;
  vec->size = vec->size + 1;
  return;
}

Assistant:

void vector_push_back(struct vector_t *vec, size_t value)
{
  if (vec->size == vec->capacity) {
    vec->capacity *= VECTOR_GROWTH_FACTOR;
    vec->values = realloc(vec->values, sizeof(*vec->values) * vec->capacity);
    if (vec->values == NULL)
      VECTOR_FATAL_ERROR("Failed to reallocate memory for vector values\n");
  }
  vec->values[vec->size] = value;
  vec->size++;
}